

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Release(ShardedLRUCache *this,Handle *handle)

{
  uint uVar1;
  Mutex *__mutex;
  
  uVar1 = *(uint *)(handle + 0x40);
  __mutex = &this->shard_[uVar1 >> 0x1c].mutex_;
  std::mutex::lock(&__mutex->mu_);
  LRUCache::Unref(this->shard_ + (uVar1 >> 0x1c),(LRUHandle *)handle);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void Release(Handle* handle) override {
    LRUHandle* h = reinterpret_cast<LRUHandle*>(handle);
    shard_[Shard(h->hash)].Release(handle);
  }